

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FileDescriptor *pFVar6;
  FieldGenerator *pFVar7;
  int extraout_EDX;
  int i_00;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX;
  char *pcVar8;
  string local_88;
  string local_58;
  FieldDescriptor *local_38;
  FieldDescriptor *field_1;
  int i_1;
  int last_index;
  FieldDescriptor *field;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  pFVar6 = Descriptor::file(this->descriptor_);
  bVar3 = HasDescriptorMethods(pFVar6);
  if (bVar3) {
    io::Printer::Print(pPStack_18,
                       "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n  GOOGLE_CHECK_NE(&from, this);\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(pPStack_18);
    io::Printer::Print(pPStack_18,
                       "const $classname$* source =\n  ::google::protobuf::internal::dynamic_cast_if_available<const $classname$*>(\n    &from);\nif (source == NULL) {\n  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n} else {\n  MergeFrom(*source);\n}\n"
                       ,"classname",&this->classname_);
    io::Printer::Outdent(pPStack_18);
    io::Printer::Print(pPStack_18,"}\n\n");
  }
  else {
    io::Printer::Print(pPStack_18,
                       "void $classname$::CheckTypeAndMergeFrom(\n    const ::google::protobuf::MessageLite& from) {\n  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n}\n\n"
                       ,"classname",&this->classname_);
  }
  io::Printer::Print(pPStack_18,
                     "void $classname$::MergeFrom(const $classname$& from) {\n  GOOGLE_CHECK_NE(&from, this);\n"
                     ,"classname",&this->classname_);
  io::Printer::Indent(pPStack_18);
  for (field._4_4_ = 0; iVar5 = field._4_4_, iVar4 = Descriptor::field_count(this->descriptor_),
      iVar5 < iVar4; field._4_4_ = field._4_4_ + 1) {
    _i_1 = Descriptor::field(this->descriptor_,field._4_4_);
    bVar3 = FieldDescriptor::is_repeated(_i_1);
    if (bVar3) {
      pFVar7 = FieldGeneratorMap::get(&this->field_generators_,_i_1);
      (*pFVar7->_vptr_FieldGenerator[7])(pFVar7,pPStack_18);
    }
  }
  field_1._4_4_ = 0xffffffff;
  for (field_1._0_4_ = 0; uVar1 = (uint)field_1, iVar5 = Descriptor::field_count(this->descriptor_),
      (int)uVar1 < iVar5; field_1._0_4_ = (uint)field_1 + 1) {
    pcVar8 = (char *)(ulong)(uint)field_1;
    local_38 = Descriptor::field(this->descriptor_,(uint)field_1);
    bVar3 = FieldDescriptor::is_repeated(local_38);
    if (!bVar3) {
      field_00 = (FieldDescriptor *)((long)(int)field_1._4_4_ % 8 & 0xffffffff);
      iVar5 = (int)((long)(int)field_1._4_4_ % 8);
      if (((int)(uint)field_1 / 8 != (int)field_1._4_4_ / 8) || ((int)field_1._4_4_ < 0)) {
        if (-1 < (int)field_1._4_4_) {
          io::Printer::Outdent(pPStack_18);
          pcVar8 = "}\n";
          io::Printer::Print(pPStack_18,"}\n");
          iVar5 = extraout_EDX;
        }
        pPVar2 = pPStack_18;
        pcVar8 = FieldDescriptor::index(local_38,pcVar8,iVar5);
        SimpleItoa_abi_cxx11_(&local_58,(protobuf *)((ulong)pcVar8 & 0xffffffff),i_00);
        io::Printer::Print(pPVar2,
                           "if (from._has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
                           "index",&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        io::Printer::Indent(pPStack_18);
        field_00 = extraout_RDX;
      }
      pPVar2 = pPStack_18;
      field_1._4_4_ = (uint)field_1;
      FieldName_abi_cxx11_(&local_88,(cpp *)local_38,field_00);
      io::Printer::Print(pPVar2,"if (from.has_$name$()) {\n","name",&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      io::Printer::Indent(pPStack_18);
      pFVar7 = FieldGeneratorMap::get(&this->field_generators_,local_38);
      (*pFVar7->_vptr_FieldGenerator[7])(pFVar7,pPStack_18);
      io::Printer::Outdent(pPStack_18);
      io::Printer::Print(pPStack_18,"}\n");
    }
  }
  if (-1 < (int)field_1._4_4_) {
    io::Printer::Outdent(pPStack_18);
    io::Printer::Print(pPStack_18,"}\n");
  }
  iVar5 = Descriptor::extension_range_count(this->descriptor_);
  if (0 < iVar5) {
    io::Printer::Print(pPStack_18,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  pFVar6 = Descriptor::file(this->descriptor_);
  bVar3 = HasUnknownFields(pFVar6);
  if (bVar3) {
    io::Printer::Print(pPStack_18,"mutable_unknown_fields()->MergeFrom(from.unknown_fields());\n");
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file())) {
    // Generate the generalized MergeFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
      "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n"
      "  GOOGLE_CHECK_NE(&from, this);\n",
      "classname", classname_);
    printer->Indent();

    // Cast the message to the proper type. If we find that the message is
    // *not* of the proper type, we can still call Merge via the reflection
    // system, as the GOOGLE_CHECK above ensured that we have the same descriptor
    // for each message.
    printer->Print(
      "const $classname$* source =\n"
      "  ::google::protobuf::internal::dynamic_cast_if_available<const $classname$*>(\n"
      "    &from);\n"
      "if (source == NULL) {\n"
      "  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n"
      "} else {\n"
      "  MergeFrom(*source);\n"
      "}\n",
      "classname", classname_);

    printer->Outdent();
    printer->Print("}\n\n");
  } else {
    // Generate CheckTypeAndMergeFrom().
    printer->Print(
      "void $classname$::CheckTypeAndMergeFrom(\n"
      "    const ::google::protobuf::MessageLite& from) {\n"
      "  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  printer->Print(
    "void $classname$::MergeFrom(const $classname$& from) {\n"
    "  GOOGLE_CHECK_NE(&from, this);\n",
    "classname", classname_);
  printer->Indent();

  // Merge Repeated fields. These fields do not require a
  // check as we can simply iterate over them.
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      field_generators_.get(field).GenerateMergingCode(printer);
    }
  }

  // Merge Optional and Required fields (after a _has_bit check).
  int last_index = -1;

  for (int i = 0; i < descriptor_->field_count(); ++i) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // See above in GenerateClear for an explanation of this.
      if (i / 8 != last_index / 8 || last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (from._has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }

      last_index = i;

      printer->Print(
        "if (from.has_$name$()) {\n",
        "name", FieldName(field));
      printer->Indent();

      field_generators_.get(field).GenerateMergingCode(printer);

      printer->Outdent();
      printer->Print("}\n");
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "mutable_unknown_fields()->MergeFrom(from.unknown_fields());\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}